

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_butcher.c
# Opt level: O3

int arkode_butcher_order6a
              (sunrealtype *b,sunrealtype *c1,sunrealtype *c2,sunrealtype *c3,sunrealtype *c4,
              sunrealtype *c5,int s)

{
  void *__ptr;
  void *__ptr_00;
  ulong uVar1;
  ulong uVar2;
  size_t __nmemb;
  double dVar3;
  
  __nmemb = (size_t)s;
  __ptr = calloc(__nmemb,8);
  __ptr_00 = calloc(__nmemb,8);
  if ((((0 < (long)__nmemb) && (c1 != (sunrealtype *)0x0)) && (c2 != (sunrealtype *)0x0)) &&
     (__ptr != (void *)0x0)) {
    uVar1 = (ulong)(uint)s;
    uVar2 = 0;
    do {
      *(double *)((long)__ptr + uVar2 * 8) = c1[uVar2] * c2[uVar2];
      uVar2 = uVar2 + 1;
    } while (uVar1 != uVar2);
    if (__ptr_00 != (void *)0x0 && c3 != (sunrealtype *)0x0) {
      uVar2 = 0;
      do {
        *(double *)((long)__ptr_00 + uVar2 * 8) = c3[uVar2] * *(double *)((long)__ptr + uVar2 * 8);
        uVar2 = uVar2 + 1;
      } while (uVar1 != uVar2);
      if (c4 != (sunrealtype *)0x0) {
        uVar2 = 0;
        do {
          *(double *)((long)__ptr + uVar2 * 8) = c4[uVar2] * *(double *)((long)__ptr_00 + uVar2 * 8)
          ;
          uVar2 = uVar2 + 1;
        } while (uVar1 != uVar2);
        if (c5 != (sunrealtype *)0x0) {
          uVar2 = 0;
          do {
            *(double *)((long)__ptr_00 + uVar2 * 8) =
                 c5[uVar2] * *(double *)((long)__ptr + uVar2 * 8);
            uVar2 = uVar2 + 1;
          } while (uVar1 != uVar2);
          if (b == (sunrealtype *)0x0) {
            return 0;
          }
          dVar3 = 0.0;
          uVar2 = 0;
          do {
            dVar3 = dVar3 + b[uVar2] * *(double *)((long)__ptr_00 + uVar2 * 8);
            uVar2 = uVar2 + 1;
          } while (uVar1 != uVar2);
          free(__ptr);
          free(__ptr_00);
          return (uint)(ABS(dVar3 + -0.16666666666666666) <= 1.4901161193847656e-08);
        }
      }
    }
  }
  free(__ptr);
  free(__ptr_00);
  return 0;
}

Assistant:

static sunbooleantype arkode_butcher_order6a(sunrealtype* b, sunrealtype* c1,
                                             sunrealtype* c2, sunrealtype* c3,
                                             sunrealtype* c4, sunrealtype* c5,
                                             int s)
{
  sunrealtype bccccc;
  sunrealtype* tmp1 = calloc(s, sizeof(sunrealtype));
  sunrealtype* tmp2 = calloc(s, sizeof(sunrealtype));
  if (arkode_butcher_vv(c1, c2, s, tmp1))
  {
    free(tmp1);
    free(tmp2);
    return (SUNFALSE);
  }
  if (arkode_butcher_vv(c3, tmp1, s, tmp2))
  {
    free(tmp1);
    free(tmp2);
    return (SUNFALSE);
  }
  if (arkode_butcher_vv(c4, tmp2, s, tmp1))
  {
    free(tmp1);
    free(tmp2);
    return (SUNFALSE);
  }
  if (arkode_butcher_vv(c5, tmp1, s, tmp2))
  {
    free(tmp1);
    free(tmp2);
    return (SUNFALSE);
  }
  if (arkode_butcher_dot(b, tmp2, s, &bccccc)) { return (SUNFALSE); }
  free(tmp1);
  free(tmp2);
  return (SUNRabs(bccccc - SUN_RCONST(1.0) / SUN_RCONST(6.0)) > TOL) ? SUNFALSE
                                                                     : SUNTRUE;
}